

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

BZFILE * BZ2_bzWriteOpen(int *bzerror,FILE *f,int blockSize100k,int verbosity,int workFactor)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  FILE *in_RSI;
  int *in_RDI;
  int in_R8D;
  bzFile *bzf;
  Int32 ret;
  int in_stack_ffffffffffffffcc;
  long lVar2;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 *local_8;
  
  lVar2 = 0;
  if (in_RDI != (int *)0x0) {
    *in_RDI = 0;
  }
  if ((((in_RSI == (FILE *)0x0) || (in_EDX < 1)) || (9 < in_EDX)) ||
     (((in_R8D < 0 || (0xfa < in_R8D)) || ((in_ECX < 0 || (4 < in_ECX)))))) {
    if (in_RDI != (int *)0x0) {
      *in_RDI = -2;
    }
    local_8 = (undefined8 *)0x0;
  }
  else {
    iVar1 = ferror(in_RSI);
    if (iVar1 == 0) {
      local_8 = (undefined8 *)malloc(0x13f0);
      if (local_8 == (undefined8 *)0x0) {
        if (in_RDI != (int *)0x0) {
          *in_RDI = -3;
        }
        local_8 = (undefined8 *)0x0;
      }
      else {
        if (in_RDI != (int *)0x0) {
          *in_RDI = 0;
        }
        if (local_8 != (undefined8 *)0x0) {
          *(undefined4 *)(local_8 + 0x27d) = 0;
        }
        *(undefined1 *)((long)local_8 + 0x13ec) = 0;
        *(undefined4 *)(local_8 + 0x272) = 0;
        *local_8 = in_RSI;
        *(undefined1 *)((long)local_8 + 0x1394) = 1;
        local_8[0x27a] = 0;
        local_8[0x27b] = 0;
        local_8[0x27c] = 0;
        if (in_R8D == 0) {
          in_R8D = 0x1e;
        }
        iVar1 = BZ2_bzCompressInit((bz_stream *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                                   (int)((ulong)local_8 >> 0x20),(int)local_8,
                                   in_stack_ffffffffffffffcc);
        if (iVar1 == 0) {
          *(undefined4 *)(local_8 + 0x274) = 0;
          *(undefined1 *)((long)local_8 + 0x13ec) = 1;
        }
        else {
          if (in_RDI != (int *)0x0) {
            *in_RDI = iVar1;
          }
          if (local_8 != (undefined8 *)0x0) {
            *(int *)(local_8 + 0x27d) = iVar1;
          }
          free(local_8);
          local_8 = (undefined8 *)0x0;
        }
      }
    }
    else {
      if (in_RDI != (int *)0x0) {
        *in_RDI = -6;
      }
      if (lVar2 != 0) {
        *(undefined4 *)(lVar2 + 0x13e8) = 0xfffffffa;
      }
      local_8 = (undefined8 *)0x0;
    }
  }
  return local_8;
}

Assistant:

BZFILE* BZ_API(BZ2_bzWriteOpen) 
                    ( int*  bzerror,      
                      FILE* f, 
                      int   blockSize100k, 
                      int   verbosity,
                      int   workFactor )
{
   Int32   ret;
   bzFile* bzf = NULL;

   BZ_SETERR(BZ_OK);

   if (f == NULL ||
       (blockSize100k < 1 || blockSize100k > 9) ||
       (workFactor < 0 || workFactor > 250) ||
       (verbosity < 0 || verbosity > 4))
      { BZ_SETERR(BZ_PARAM_ERROR); return NULL; };

   if (ferror(f))
      { BZ_SETERR(BZ_IO_ERROR); return NULL; };

   bzf = malloc ( sizeof(bzFile) );
   if (bzf == NULL)
      { BZ_SETERR(BZ_MEM_ERROR); return NULL; };

   BZ_SETERR(BZ_OK);
   bzf->initialisedOk = False;
   bzf->bufN          = 0;
   bzf->handle        = f;
   bzf->writing       = True;
   bzf->strm.bzalloc  = NULL;
   bzf->strm.bzfree   = NULL;
   bzf->strm.opaque   = NULL;

   if (workFactor == 0) workFactor = 30;
   ret = BZ2_bzCompressInit ( &(bzf->strm), blockSize100k, 
                              verbosity, workFactor );
   if (ret != BZ_OK)
      { BZ_SETERR(ret); free(bzf); return NULL; };

   bzf->strm.avail_in = 0;
   bzf->initialisedOk = True;
   return bzf;   
}